

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackendOpCodeAttr.cpp
# Opt level: O0

int OpCodeAttr::GetOpCodeDebugAttributes(OpCode op)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  uint opIndex;
  uint opIndex_1;
  OpCode op_local;
  
  opIndex._2_2_ = op;
  if (op < InvalidOpCode) {
    bVar2 = Js::operator<((OpCode *)((long)&opIndex + 2),0x100);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/BackendOpCodeAttr.cpp"
                         ,0x104,"(op < (sizeof(*__countof_helper(OpcodeDebugAttributes)) + 0))",
                         "op < (sizeof(*__countof_helper(OpcodeDebugAttributes)) + 0)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    opIndex_1 = *(uint *)(OpcodeDebugAttributes + (long)(int)(uint)opIndex._2_2_ * 4);
  }
  else if (op < ByteCodeLast) {
    uVar3 = Js::operator+(MaxByteSizedOpcodes,1);
    uVar3 = Js::operator-(op,uVar3);
    if (0x88 < uVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/BackendOpCodeAttr.cpp"
                         ,0x10a,
                         "(opIndex < (sizeof(*__countof_helper(ExtendedOpcodeDebugAttributes)) + 0))"
                         ,"opIndex < (sizeof(*__countof_helper(ExtendedOpcodeDebugAttributes)) + 0)"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    opIndex_1 = *(uint *)(ExtendedOpcodeDebugAttributes + (ulong)uVar3 * 4);
  }
  else {
    uVar3 = Js::operator+(ByteCodeLast,1);
    uVar3 = Js::operator-(op,uVar3);
    if (0x328 < uVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/BackendOpCodeAttr.cpp"
                         ,0x10e,
                         "(opIndex < (sizeof(*__countof_helper(BackendOpCodeDebugAttributes)) + 0))"
                         ,"opIndex < (sizeof(*__countof_helper(BackendOpCodeDebugAttributes)) + 0)")
      ;
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    opIndex_1 = *(uint *)(BackendOpCodeDebugAttributes + (ulong)uVar3 * 4);
  }
  return opIndex_1;
}

Assistant:

static const int GetOpCodeDebugAttributes(Js::OpCode op)
{
    if (op <= Js::OpCode::MaxByteSizedOpcodes)
    {
        AnalysisAssert(op < _countof(OpcodeDebugAttributes));
        return OpcodeDebugAttributes[(int)op];
    }
    else if (op < Js::OpCode::ByteCodeLast)
    {
        uint opIndex = op - (Js::OpCode::MaxByteSizedOpcodes + 1);
        AnalysisAssert(opIndex < _countof(ExtendedOpcodeDebugAttributes));
        return ExtendedOpcodeDebugAttributes[opIndex];
    }
    uint opIndex = op - (Js::OpCode::ByteCodeLast + 1);
    AnalysisAssert(opIndex < _countof(BackendOpCodeDebugAttributes));
    return BackendOpCodeDebugAttributes[opIndex];
}